

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O2

void R_InstallSprite(int num)

{
  undefined8 *puVar1;
  ushort uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  TextureHash *pTVar11;
  spriteframe_t *psVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  int rot;
  long lVar19;
  long lVar20;
  
  if (maxframe == -1) {
    sprites.Array[num].numframes = '\0';
  }
  else {
    uVar17 = maxframe + 1;
    lVar19 = 0xa1422c;
    lVar20 = 0xa14228;
    maxframe = uVar17;
    for (lVar16 = 0; lVar16 < (int)uVar17; lVar16 = lVar16 + 1) {
      iVar3 = *(int *)&sprtemp[lVar16].super_spriteframe_t.field_0x4c;
      if (iVar3 == 1) {
        for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 2) {
          iVar3 = *(int *)(lVar19 + -4 + lVar13 * 4);
          iVar18 = *(int *)(lVar19 + lVar13 * 4);
          if (iVar18 < 1) {
            *(int *)(lVar19 + lVar13 * 4) = iVar3;
            uVar2 = sprtemp[lVar16].super_spriteframe_t.Flip;
            iVar18 = iVar3;
            if ((uVar2 >> ((uint)lVar13 & 0x1f) & 1) != 0) {
              sprtemp[lVar16].super_spriteframe_t.Flip =
                   uVar2 | (ushort)(2 << ((byte)lVar13 & 0x1f));
            }
          }
          if (iVar3 < 1) {
            *(int *)(lVar19 + -4 + lVar13 * 4) = iVar18;
            uVar2 = sprtemp[lVar16].super_spriteframe_t.Flip;
            if ((uVar2 >> ((byte)lVar13 & 0x1f) & 2) != 0) {
              sprtemp[lVar16].super_spriteframe_t.Flip =
                   uVar2 | (ushort)(1 << ((uint)lVar13 & 0x1f));
            }
          }
        }
        for (lVar13 = 0; uVar17 = maxframe, lVar13 != 0x10; lVar13 = lVar13 + 1) {
          if (*(int *)(lVar20 + lVar13 * 4) < 1) {
            I_FatalError("R_InstallSprite: Sprite %s frame %c is missing rotations",
                         sprites.Array + num,(ulong)((int)lVar16 + 0x41));
          }
        }
      }
      else if (iVar3 == 0) {
        for (lVar13 = 0; lVar13 != 0xf; lVar13 = lVar13 + 1) {
          *(int *)(lVar19 + lVar13 * 4) = sprtemp[lVar16].super_spriteframe_t.Texture[0].texnum;
        }
        if ((sprtemp[lVar16].super_spriteframe_t.Flip & 1) != 0) {
          sprtemp[lVar16].super_spriteframe_t.Flip = 0xffff;
        }
      }
      lVar19 = lVar19 + 0x50;
      lVar20 = lVar20 + 0x50;
    }
    lVar16 = 0;
    uVar14 = 0;
    if (0 < (int)uVar17) {
      uVar14 = (ulong)uVar17;
    }
    for (; uVar14 * 0x50 - lVar16 != 0; lVar16 = lVar16 + 0x50) {
      if (*(int *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x11) + lVar16) == -1) {
        *(undefined4 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x11) + lVar16) = 0;
        *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0xc].texnum + lVar16) = 0;
        *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0xe].texnum + lVar16) = 0;
        *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[8].texnum + lVar16) = 0;
        *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[10].texnum + lVar16) = 0;
        *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0].texnum + lVar16) = 0;
        *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[2].texnum + lVar16) = 0;
        *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[4].texnum + lVar16) = 0;
        *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[6].texnum + lVar16) = 0;
        *(undefined2 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x10) + lVar16) = 0;
      }
    }
    sprites.Array[num].numframes = (BYTE)uVar17;
    uVar17 = TArray<spriteframe_t,_spriteframe_t>::Reserve(&SpriteFrames,uVar17);
    sprites.Array[num].spriteframes = (WORD)uVar17;
    psVar12 = SpriteFrames.Array;
    uVar15 = 0;
    uVar14 = (ulong)(uint)maxframe;
    if (maxframe < 1) {
      uVar14 = uVar15;
    }
    for (; pTVar11 = TexMan.Textures.Array, uVar14 * 0x50 - uVar15 != 0; uVar15 = uVar15 + 0x50) {
      uVar4 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0].texnum + uVar15);
      uVar5 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[2].texnum + uVar15);
      uVar6 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[4].texnum + uVar15);
      uVar7 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[6].texnum + uVar15);
      uVar8 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[8].texnum + uVar15);
      uVar9 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[10].texnum + uVar15);
      uVar10 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0xe].texnum + uVar15);
      puVar1 = (undefined8 *)((long)&psVar12[(int)uVar17].Texture[0xc].texnum + uVar15);
      *puVar1 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0xc].texnum + uVar15);
      puVar1[1] = uVar10;
      puVar1 = (undefined8 *)((long)&psVar12[(int)uVar17].Texture[8].texnum + uVar15);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      puVar1 = (undefined8 *)((long)&psVar12[(int)uVar17].Texture[4].texnum + uVar15);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)((long)&psVar12[(int)uVar17].Texture[0].texnum + uVar15);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      *(undefined2 *)((long)(psVar12[(int)uVar17].Texture + 0x10) + uVar15) =
           *(undefined2 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x10) + uVar15);
      *(undefined8 *)((long)&((spriteframe_t *)(psVar12[(int)uVar17].Texture + -2))->Voxel + uVar15)
           = *(undefined8 *)
              ((long)&((spriteframe_t *)(sprtemp[0].super_spriteframe_t.Texture + -2))->Voxel +
              uVar15);
    }
    lVar16 = 0xa14228;
    for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      if (*(int *)&sprtemp[uVar15].super_spriteframe_t.field_0x4c == 1) {
        for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
          (pTVar11[*(int *)(lVar16 + lVar19 * 4)].Texture)->Rotations = (WORD)uVar17 + (short)uVar15
          ;
        }
      }
      lVar16 = lVar16 + 0x50;
    }
  }
  return;
}

Assistant:

static void R_InstallSprite (int num)
{
	int frame;
	int framestart;
	int rot;
//	int undefinedFix;

	if (maxframe == -1)
	{
		sprites[num].numframes = 0;
		return;
	}

	maxframe++;

	// [RH] If any frames are undefined, but there are some defined frames, map
	// them to the first defined frame. This is a fix for Doom Raider, which actually
	// worked with ZDoom 2.0.47, because of a bug here. It does not define frames A,
	// B, or C for the sprite PSBG, but because I had sprtemp[].rotate defined as a
	// bool, this code never detected that it was not actually present. After switching
	// to the unified texture system, this caused it to crash while loading the wad.

// [RH] Let undefined frames actually be blank because LWM uses this in at least
// one of her wads.
//	for (frame = 0; frame < maxframe && sprtemp[frame].rotate == -1; ++frame)
//	{ }
//
//	undefinedFix = frame;

	for (frame = 0; frame < maxframe; ++frame)
	{
		switch (sprtemp[frame].rotate)
		{
		case -1:
			// no rotations were found for that frame at all
			//I_FatalError ("R_InstallSprite: No patches found for %s frame %c", sprites[num].name, frame+'A');
			break;
			
		case 0:
			// only the first rotation is needed
			for (rot = 1; rot < 16; ++rot)
			{
				sprtemp[frame].Texture[rot] = sprtemp[frame].Texture[0];
			}
			// If the frame is flipped, they all should be
			if (sprtemp[frame].Flip & 1)
			{
				sprtemp[frame].Flip = 0xFFFF;
			}
			break;
					
		case 1:
			// must have all 8 frame pairs
			for (rot = 0; rot < 8; ++rot)
			{
				if (!sprtemp[frame].Texture[rot*2+1].isValid())
				{
					sprtemp[frame].Texture[rot*2+1] = sprtemp[frame].Texture[rot*2];
					if (sprtemp[frame].Flip & (1 << (rot*2)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2+1);
					}
				}
				if (!sprtemp[frame].Texture[rot*2].isValid())
				{
					sprtemp[frame].Texture[rot*2] = sprtemp[frame].Texture[rot*2+1];
					if (sprtemp[frame].Flip & (1 << (rot*2+1)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2);
					}
				}

			}
			for (rot = 0; rot < 16; ++rot)
			{
				if (!sprtemp[frame].Texture[rot].isValid())
					I_FatalError ("R_InstallSprite: Sprite %s frame %c is missing rotations",
									sprites[num].name, frame+'A');
			}
			break;
		}
	}

	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == -1)
		{
			memset (&sprtemp[frame].Texture, 0, sizeof(sprtemp[0].Texture));
			sprtemp[frame].Flip = 0;
			sprtemp[frame].rotate = 0;
		}
	}
	
	// allocate space for the frames present and copy sprtemp to it
	sprites[num].numframes = maxframe;
	sprites[num].spriteframes = WORD(framestart = SpriteFrames.Reserve (maxframe));
	for (frame = 0; frame < maxframe; ++frame)
	{
		memcpy (SpriteFrames[framestart+frame].Texture, sprtemp[frame].Texture, sizeof(sprtemp[frame].Texture));
		SpriteFrames[framestart+frame].Flip = sprtemp[frame].Flip;
		SpriteFrames[framestart+frame].Voxel = sprtemp[frame].Voxel;
	}

	// Let the textures know about the rotations
	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == 1)
		{
			for (int rot = 0; rot < 16; ++rot)
			{
				TexMan[sprtemp[frame].Texture[rot]]->Rotations = framestart + frame;
			}
		}
	}
}